

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O0

void FCanvasTextureInfo::Serialize(FArchive *arc)

{
  bool bVar1;
  FArchive *pFVar2;
  FTextureID local_30;
  int local_2c;
  FTextureID picnum;
  int fov;
  AActor *viewpoint;
  AActor *nullactor;
  FCanvasTextureInfo *probe;
  FArchive *arc_local;
  
  probe = (FCanvasTextureInfo *)arc;
  bVar1 = FArchive::IsStoring(arc);
  if (bVar1) {
    for (nullactor = (AActor *)List; nullactor != (AActor *)0x0;
        nullactor = (AActor *)(nullactor->super_DThinker).super_DObject._vptr_DObject) {
      if (((nullactor->super_DThinker).super_DObject.ObjNext != (DObject *)0x0) &&
         (bVar1 = TObjPtr<AActor>::operator!=
                            ((TObjPtr<AActor> *)&(nullactor->super_DThinker).super_DObject.Class,
                             (AActor *)0x0), bVar1)) {
        pFVar2 = ::operator<<((FArchive *)probe,
                              (TObjPtr<AActor> *)&(nullactor->super_DThinker).super_DObject.Class);
        pFVar2 = FArchive::operator<<
                           (pFVar2,(SDWORD *)
                                   ((long)&(nullactor->super_DThinker).super_DObject.GCNext + 4));
        ::operator<<(pFVar2,(FTextureID *)&(nullactor->super_DThinker).super_DObject.GCNext);
      }
    }
    viewpoint = (AActor *)0x0;
    ::operator<<((FArchive *)probe,&viewpoint);
  }
  else {
    FTextureID::FTextureID(&local_30);
    EmptyList();
    while (::operator<<((FArchive *)probe,(AActor **)&picnum), _picnum != (AActor *)0x0) {
      pFVar2 = FArchive::operator<<((FArchive *)probe,&local_2c);
      ::operator<<(pFVar2,&local_30);
      Add(_picnum,local_30,local_2c);
    }
  }
  return;
}

Assistant:

void FCanvasTextureInfo::Serialize (FArchive &arc)
{
	if (arc.IsStoring ())
	{
		FCanvasTextureInfo *probe;

		for (probe = List; probe != NULL; probe = probe->Next)
		{
			if (probe->Texture != NULL && probe->Viewpoint != NULL)
			{
				arc << probe->Viewpoint << probe->FOV << probe->PicNum;
			}
		}
		AActor *nullactor = NULL;
		arc << nullactor;
	}
	else
	{
		AActor *viewpoint;
		int fov;
		FTextureID picnum;
		
		EmptyList ();
		while (arc << viewpoint, viewpoint != NULL)
		{
			arc << fov << picnum;
			Add (viewpoint, picnum, fov);
		}
	}
}